

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

size_t ZSTD_initDStream(ZSTD_DStream *zds)

{
  size_t sVar1;
  
  sVar1 = ZSTD_initDStream_usingDDict(zds,(ZSTD_DDict *)0x0);
  return sVar1;
}

Assistant:

size_t ZSTD_initDStream(ZSTD_DStream* zds)
{
    DEBUGLOG(4, "ZSTD_initDStream");
    return ZSTD_initDStream_usingDDict(zds, NULL);
}